

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O2

void __thiscall
HashtableDeathTest_ResizeOverflow_Test::TestBody(HashtableDeathTest_ResizeOverflow_Test *this)

{
  bool bVar1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  AssertHelper local_e0;
  AssertHelper local_d8 [4];
  sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ht2;
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ht;
  
  google::
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::dense_hash_map(&ht,0,(hasher *)&ht2,(key_equal *)&local_100,(allocator_type *)local_d8);
  ht2.rep.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  enlarge_threshold_ =
       (size_type)
       &ht2.rep.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
        enlarge_factor_;
  ht2.rep.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  enlarge_factor_ = 0.0;
  ht2.rep.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.shrink_factor_
       = 0.0;
  ht2.rep.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  consider_shrink_ = false;
  ht2.rep.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.use_empty_ =
       false;
  ht2.rep.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.use_deleted_ =
       false;
  ht2.rep.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>._27_1_ = 0;
  ht2.rep.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.num_ht_copies_
       = 0;
  ht2.rep.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  shrink_threshold_ = 0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    google::
    dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
    ::resize(&ht.rep,0xffffffffffffffff);
  }
  std::__cxx11::string::assign((char *)&ht2);
  testing::Message::Message((Message *)&local_100);
  testing::internal::AssertHelper::AssertHelper
            (local_d8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
             ,0x60d,(char *)ht2.rep.settings.
                            super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
                            enlarge_threshold_);
  testing::internal::AssertHelper::operator=(local_d8,(Message *)&local_100);
  testing::internal::AssertHelper::~AssertHelper(local_d8);
  if (local_100._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_100._M_head_impl + 8))();
  }
  std::__cxx11::string::~string((string *)&ht2);
  google::
  sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::sparse_hash_map(&ht2,0,(hasher *)&local_100,(key_equal *)local_d8,(allocator_type *)&local_e0);
  local_100._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f0;
  local_f0 = 0;
  uStack_e8 = 0;
  local_f8 = 0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    google::
    sparse_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
    ::resize(&ht2.rep,0xffffffffffffffff);
  }
  std::__cxx11::string::assign((char *)&local_100);
  testing::Message::Message((Message *)local_d8);
  testing::internal::AssertHelper::AssertHelper
            (&local_e0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
             ,0x610,(char *)local_100._M_head_impl);
  testing::internal::AssertHelper::operator=(&local_e0,(Message *)local_d8);
  testing::internal::AssertHelper::~AssertHelper(&local_e0);
  if (local_d8[0].data_ != (AssertHelperData *)0x0) {
    (**(code **)(*(long *)local_d8[0].data_ + 8))();
  }
  std::__cxx11::string::~string((string *)&local_100);
  std::
  vector<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>_>_>
  ::~vector(&ht2.rep.table.groups);
  free(ht.rep.table);
  return;
}

Assistant:

TEST(HashtableDeathTest, ResizeOverflow) {
  dense_hash_map<int, int> ht;
  EXPECT_THROW(ht.resize(static_cast<size_t>(-1)), std::length_error);

  sparse_hash_map<int, int> ht2;
  EXPECT_THROW(ht2.resize(static_cast<size_t>(-1)), std::length_error);
}